

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.cpp
# Opt level: O3

bool convertIterableToVariantMap(QMetaType fromType,void *from,void *to)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QString local_d0;
  undefined1 local_b8 [16];
  QAssociativeIterable local_a8;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_90 = 0xaaaaaaaa00000000;
  local_88 = 0;
  uStack_80 = 0;
  bVar1 = QMetaType::convert(fromType,from,(QMetaType)0x6ad858,&local_90);
  if (bVar1) {
    QMap<QString,_QVariant>::clear((QMap<QString,_QVariant> *)to);
    local_a8.super_QIterable<QMetaAssociation>._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a8.super_QIterable<QMetaAssociation>.m_iterable.m_pointer.d =
         (QTaggedPointer<unsigned_short,_QtPrivate::QConstPreservingPointer<void,_unsigned_short>::Tag>
          )&DAT_aaaaaaaaaaaaaaaa;
    QAssociativeIterable::constEnd(&local_a8);
    local_b8._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_b8._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QAssociativeIterable::constBegin((QAssociativeIterable *)local_b8);
    while( true ) {
      local_58.shared =
           (PrivateShared *)*(undefined8 *)((local_b8._0_8_ & 0xfffffffffffffff8) + 0x10);
      bVar2 = QMetaContainer::compareConstIterator
                        ((QMetaContainer *)&local_58.shared,(void *)local_b8._8_8_,
                         (void *)local_a8.super_QIterable<QMetaAssociation>.m_iterable.m_pointer.d);
      if (bVar2) break;
      QAssociativeConstIterator::key((QVariant *)&local_58,(QAssociativeConstIterator *)local_b8);
      QVariant::toString(&local_d0,(QVariant *)&local_58);
      QAssociativeConstIterator::value(&local_78,(QAssociativeConstIterator *)local_b8);
      QMap<QString,_QVariant>::insert((QMap<QString,_QVariant> *)to,&local_d0,&local_78);
      QVariant::~QVariant(&local_78);
      if (&(local_d0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_d0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_d0.d.d)->super_QArrayData,2,0x10);
        }
      }
      QVariant::~QVariant((QVariant *)&local_58);
      local_58.shared =
           (PrivateShared *)*(undefined8 *)((local_b8._0_8_ & 0xfffffffffffffff8) + 0x10);
      QMetaContainer::advanceConstIterator
                ((QMetaContainer *)&local_58.shared,(void *)local_b8._8_8_,1);
    }
    QBaseIterator<QMetaAssociation>::clearIterator((QBaseIterator<QMetaAssociation> *)local_b8);
    QBaseIterator<QMetaAssociation>::clearIterator((QBaseIterator<QMetaAssociation> *)&local_a8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool convertIterableToVariantMap(QMetaType fromType, const void *from, void *to)
{
    QAssociativeIterable map;
    if (!QMetaType::convert(fromType, from, QMetaType::fromType<QAssociativeIterable>(), &map))
        return false;

    QVariantMap &h = *static_cast<QVariantMap *>(to);
    h.clear();
    auto end = map.end();
    for (auto it = map.begin(); it != end; ++it)
        h.insert(it.key().toString(), it.value());
    return true;
}